

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O1

void CALCT(int *BOOL,int NN,double *SR,double *SI,double *HR,double *HI,double *QHR,double *QHI,
          double ARE,double INFINY,double *PVR,double *PVI,double *TR,double *TI)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_80;
  double pvrt;
  double pvit;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double local_40;
  double local_38;
  
  *QHR = *HR;
  local_40 = *HI;
  *QHI = local_40;
  local_48 = *QHR;
  if (2 < NN) {
    uVar2 = 1;
    do {
      dVar3 = local_48 * *SI;
      local_48 = (local_48 * *SR - *SI * local_40) + HR[uVar2];
      local_40 = dVar3 + *SR * local_40 + HI[uVar2];
      QHR[uVar2] = local_48;
      QHI[uVar2] = local_40;
      uVar2 = uVar2 + 1;
    } while (NN - 1 != uVar2);
  }
  dVar3 = ABS(local_48);
  dVar6 = ABS(local_40);
  pvit = INFINY;
  if (dVar6 <= dVar3) {
    if (dVar3 <= dVar6) {
      dVar4 = 1.4142135623730951;
    }
    else {
      dVar4 = (dVar6 / dVar3) * (dVar6 / dVar3) + 1.0;
      if (dVar4 < 0.0) {
        uStack_50 = 0;
        local_58 = dVar3;
        local_38 = ARE;
        dVar4 = sqrt(dVar4);
        dVar3 = local_58;
        ARE = local_38;
      }
      else {
        dVar4 = SQRT(dVar4);
      }
    }
    dVar4 = dVar4 * dVar3;
  }
  else {
    dVar4 = (dVar3 / dVar6) * (dVar3 / dVar6) + 1.0;
    if (dVar4 < 0.0) {
      uStack_50 = 0;
      local_58 = dVar6;
      local_38 = ARE;
      dVar4 = sqrt(dVar4);
      dVar6 = local_58;
      ARE = local_38;
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar4 = dVar4 * dVar6;
  }
  dVar7 = ARE * 10.0;
  dVar3 = ABS(HR[NN - 2U]);
  dVar6 = ABS(HI[NN - 2U]);
  if (dVar6 <= dVar3) {
    if (dVar3 <= dVar6) {
      dVar5 = 1.4142135623730951;
    }
    else {
      dVar5 = (dVar6 / dVar3) * (dVar6 / dVar3) + 1.0;
      if (dVar5 < 0.0) {
        uStack_60 = 0;
        local_68 = dVar3;
        local_58 = dVar4;
        local_38 = dVar7;
        dVar5 = sqrt(dVar5);
        dVar4 = local_58;
        dVar3 = local_68;
        dVar7 = local_38;
      }
      else {
        dVar5 = SQRT(dVar5);
      }
    }
    dVar5 = dVar5 * dVar3;
  }
  else {
    dVar5 = (dVar3 / dVar6) * (dVar3 / dVar6) + 1.0;
    if (dVar5 < 0.0) {
      uStack_60 = 0;
      local_68 = dVar6;
      local_58 = dVar4;
      local_38 = dVar7;
      dVar5 = sqrt(dVar5);
      dVar4 = local_58;
      dVar6 = local_68;
      dVar7 = local_38;
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar5 = dVar5 * dVar6;
  }
  bVar1 = dVar7 * dVar5 < dVar4;
  *BOOL = (uint)!bVar1;
  local_80 = -*PVR;
  pvrt = -*PVI;
  if (bVar1) {
    CDIVID(&local_80,&pvrt,&local_48,&local_40,pvit,TR,TI);
  }
  else {
    *TR = 0.0;
    *TI = 0.0;
  }
  return;
}

Assistant:

static void CALCT(int *BOOL, int NN, double *SR, double *SI, double *HR, double *HI,double *QHR, double *QHI,double ARE, double INFINY,double *PVR, double *PVI,double *TR, double *TI ) {
	/*
	C COMPUTES  T = -P(S)/H(S).
	C BOOL   - LOGICAL, SET TRUE IF H(S) IS ESSENTIALLY ZERO.
	*/
	double HVR, HVI, pvrt,pvit;
	int N;
	N = NN - 1;
	POLYEV(N, SR, SI, HR, HI, QHR, QHI, &HVR, &HVI);

	if (CMOD(&HVR, &HVI) <= ARE*10.0*CMOD(&HR[N - 1], &HI[N - 1])) {
		*BOOL = 1;
	}
	else {
		*BOOL = 0;
	}
	pvrt = -1.0 * *PVR;
	pvit = -1.0 * *PVI;
	if (*BOOL == 0) {
		CDIVID(&pvrt, &pvit, &HVR, &HVI, INFINY,TR, TI);
	}
	else {
		*TR = 0.0;
		*TI = 0.0;
	}

}